

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2.hpp
# Opt level: O0

void crypto::hmac<crypto::iterated_hash<crypto::sha256_transform>_>::prepare_state
               (char *password,size_t length,hash_word *istate,hash_word *ostate)

{
  EVP_PKEY_CTX *in_RSI;
  void *in_RDI;
  size_t i;
  iterated_hash<crypto::sha256_transform> hash;
  char okey [64];
  char ikey [64];
  ulong count;
  char *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  iterated_hash<crypto::sha256_transform> *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  iterated_hash<crypto::sha256_transform> *in_stack_ffffffffffffff20;
  byte local_a8 [64];
  EVP_PKEY_CTX local_68 [88];
  EVP_PKEY_CTX *local_10;
  
  if (in_RSI < (EVP_PKEY_CTX *)0x41) {
    local_10 = in_RSI;
    memcpy(local_68,in_RDI,(size_t)in_RSI);
  }
  else {
    iterated_hash<crypto::sha256_transform>::init
              ((iterated_hash<crypto::sha256_transform> *)&stack0xfffffffffffffef0,in_RSI);
    iterated_hash<crypto::sha256_transform>::update
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    iterated_hash<crypto::sha256_transform>::finalize
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_10 = (EVP_PKEY_CTX *)0x20;
  }
  memset(local_68 + (long)local_10,0,0x40 - (long)local_10);
  for (count = 0; count < 0x40; count = count + 1) {
    local_a8[count] = (byte)local_68[count] ^ 0x5c;
    local_68[count] = (EVP_PKEY_CTX)((byte)local_68[count] ^ 0x36);
  }
  iterated_hash<crypto::sha256_transform>::prepare_state
            (in_stack_fffffffffffffef0,count,(hash_word *)0x187173);
  iterated_hash<crypto::sha256_transform>::prepare_state
            (in_stack_fffffffffffffef0,count,(hash_word *)0x18718a);
  return;
}

Assistant:

static void prepare_state(const char * password, size_t length, state_t istate, state_t ostate) {
		
		char ikey[block_size], okey[block_size];
		if(length > block_size) {
			T hash;
			hash.init();
			hash.update(password, length);
			hash.finalize(ikey);
			length = hash_size;
		} else {
			std::memcpy(ikey, password, length);
		}
		std::memset(ikey + length, 0, block_size - length);
		
		for(size_t i = 0; i < block_size; i++) {
			okey[i] = char(boost::uint8_t(ikey[i]) ^ boost::uint8_t(0x5c));
			ikey[i] = char(boost::uint8_t(ikey[i]) ^ boost::uint8_t(0x36));
		}
		
		T::prepare_state(ikey, 1, istate);
		T::prepare_state(okey, 1, ostate);
		
	}